

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

bool __thiscall cppcms::impl::cgi::fastcgi::parse_pairs(fastcgi *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  string_pool *psVar3;
  size_type sVar4;
  char *len;
  fastcgi *in_RDI;
  char *value;
  char *name;
  uint32_t vlen;
  uint32_t nlen;
  uchar *e;
  uchar *p;
  char *in_stack_00000090;
  char *in_stack_00000098;
  string_map *in_stack_000000a0;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string_pool *local_18 [3];
  
  psVar3 = (string_pool *)std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffffc0)
  ;
  local_18[0] = psVar3;
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&in_RDI->body_);
  psVar3 = (string_pool *)((long)&psVar3->page_size_ + sVar4);
  while( true ) {
    if (psVar3 <= local_18[0]) {
      return true;
    }
    uVar1 = read_len(in_RDI,(uchar **)local_18,(uchar *)psVar3);
    uVar2 = read_len(in_RDI,(uchar **)local_18,(uchar *)psVar3);
    if ((uVar1 == 0xffffffff) || (uVar2 == 0xffffffff)) {
      return false;
    }
    if ((uint)((int)psVar3 - (int)local_18[0]) < uVar1) {
      return false;
    }
    len = string_pool::add(psVar3,(char *)CONCAT44(uVar1,uVar2),0);
    local_18[0] = (string_pool *)((long)&local_18[0]->page_size_ + (ulong)uVar1);
    if ((uint)((int)psVar3 - (int)local_18[0]) < uVar2) break;
    string_pool::add(psVar3,(char *)CONCAT44(uVar1,uVar2),(size_t)len);
    local_18[0] = (string_pool *)((long)&local_18[0]->page_size_ + (ulong)uVar2);
    string_map::add(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  }
  return false;
}

Assistant:

bool parse_pairs()
		{
			unsigned char const *p=reinterpret_cast<unsigned char const *>(&body_.front());
			unsigned char const *e=p + body_.size();
			while(p<e) {
				uint32_t nlen=read_len(p,e);
				uint32_t vlen=read_len(p,e);
				if(nlen == 0xFFFFFFFFu || vlen == 0xFFFFFFFFu)
					return false;
				char *name=0;
				if(uint32_t(e - p) >= nlen) { // don't chage order -- prevent integer overflow
					name = pool_.add(reinterpret_cast<char const *>(p),nlen);
					p+=nlen;
				}
				else {
					return false;
				}
				char *value = 0;
				if(uint32_t(e - p) >= vlen) { // don't chage order -- prevent integer overflow
					value = pool_.add(reinterpret_cast<char const *>(p),vlen);
					p+=vlen;
				}
				else {
					return false;
				}
				env_.add(name,value);
			}
			return true;
		}